

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *rhs)

{
  undefined8 uVar1;
  _Head_base<0UL,_std::complex<float>_*,_false> __p;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t k;
  long lVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> new_data;
  _Head_base<0UL,_std::complex<float>_*,_false> local_50;
  data_type *local_48;
  long local_40;
  long local_38;
  
  lVar2 = this->size_;
  if (lVar2 == rhs->size_) {
    init_unique_array<std::complex<float>>((dense *)&local_50,lVar2 * lVar2);
    local_48 = &this->data_;
    lVar2 = this->size_;
    local_40 = 0;
    for (lVar3 = 0; __p._M_head_impl = local_50._M_head_impl, lVar3 < lVar2; lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 < lVar2; lVar4 = lVar4 + 1) {
        local_38 = lVar4 * 8;
        lVar5 = 0;
        for (lVar6 = 0; lVar6 < lVar2; lVar6 = lVar6 + 1) {
          std::operator*((local_48->_M_t).
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                         lVar2 * lVar6 + lVar4,
                         (complex<float> *)
                         ((long)&((rhs->data_)._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
                                 ->_M_value + lVar5 + rhs->size_ * local_40));
          lVar2 = this->size_ * lVar3;
          uVar1 = *(undefined8 *)((long)&local_50._M_head_impl[lVar2]._M_value + local_38);
          *(ulong *)((long)&local_50._M_head_impl[lVar2]._M_value + local_38) =
               CONCAT44(extraout_XMM0_Db + (float)((ulong)uVar1 >> 0x20),
                        extraout_XMM0_Da + (float)uVar1);
          lVar2 = this->size_;
          lVar5 = lVar5 + 8;
        }
      }
      local_40 = local_40 + 8;
    }
    local_50._M_head_impl = (complex<float> *)0x0;
    std::__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>::reset
              ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> *)
               local_48,__p._M_head_impl);
    std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
              ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
               &local_50);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator*=(const SquareMatrix<T> &) [T = std::complex<float>]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }